

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

bool DirUtils::IsSameDir(string *p1,string *p2)

{
  int iVar1;
  bool bVar2;
  string s2;
  string s1;
  string local_58;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  AbsPath(p1,&local_38);
  AbsPath(p2,&local_58);
  if (local_38._M_string_length == local_58._M_string_length) {
    if (local_38._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38._M_dataplus._M_p,local_58._M_dataplus._M_p,local_38._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool DirUtils::IsSameDir(const string& p1, const string& p2){
	string s1, s2;
	AbsPath(p1, s1);
	AbsPath(p2, s2);
	return s1 == s2;
}